

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

void __thiscall
rr::FragmentProcessor::executeBlendFactorComputeRGB
          (FragmentProcessor *this,Vec4 *blendColor,BlendState *blendRGBState)

{
  undefined4 uVar1;
  float fVar2;
  int regSampleNdx;
  long lVar3;
  int i;
  long lVar4;
  uint uVar5;
  float fVar6;
  Vector<float,_3> res;
  undefined8 local_18;
  float local_10;
  float afStack_c [3];
  
  switch(blendRGBState->srcFunc) {
  case BLENDFUNC_ZERO:
    lVar3 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3 + 8) = 0;
        *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3) = 0;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x2100);
    break;
  case BLENDFUNC_ONE:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC_COLOR:
    lVar3 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 8);
        *(undefined8 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3) =
             *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3);
        *(undefined4 *)((long)this->m_sampleRegister[0].blendSrcFactorRGB.m_data + lVar3 + 8) =
             uVar1;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          afStack_c[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_18 = *(undefined8 *)this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data;
        local_10 = this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar4 = 0;
        do {
          res.m_data[lVar4] = afStack_c[lVar4] - *(float *)((long)&local_18 + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_DST_COLOR:
    lVar3 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar3) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x14);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x1c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             uVar1;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          afStack_c[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_18 = *(undefined8 *)this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data;
        local_10 = this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar4 = 0;
        do {
          res.m_data[lVar4] = afStack_c[lVar4] - *(float *)((long)&local_18 + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0 - fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_DST_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0 - fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    lVar3 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar3) == '\x01')
      {
        fVar2 = blendColor->m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)blendColor->m_data;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) = fVar2
        ;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          afStack_c[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_18 = *(undefined8 *)blendColor->m_data;
        local_10 = blendColor->m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar4 = 0;
        do {
          res.m_data[lVar4] = afStack_c[lVar4] - *(float *)((long)&local_18 + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = blendColor->m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = blendColor->m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0 - fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar6 = 1.0 - this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data[3];
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data[3];
        uVar5 = -(uint)(fVar2 <= fVar6);
        lVar4 = 0;
        do {
          res.m_data[lVar4] = (float)(uVar5 & (uint)fVar2 | ~uVar5 & (uint)fVar6);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC1_COLOR:
    lVar3 = 0x3c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -4) + lVar3) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x24);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x2c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             uVar1;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x213c);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          afStack_c[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_18 = *(undefined8 *)this->m_sampleRegister[lVar3].clampedBlendSrc1Color.m_data;
        local_10 = this->m_sampleRegister[lVar3].clampedBlendSrc1Color.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar4 = 0;
        do {
          res.m_data[lVar4] = afStack_c[lVar4] - *(float *)((long)&local_18 + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC1_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrc1Color.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrc1Color.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0 - fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendSrcFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
  }
  switch(blendRGBState->dstFunc) {
  case BLENDFUNC_ZERO:
    lVar3 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        *(undefined4 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3 + 8) = 0;
        *(undefined8 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3) = 0;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x2100);
    break;
  case BLENDFUNC_ONE:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC_COLOR:
    lVar3 = 0;
    do {
      if (*(char *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) ==
          '\x01') {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + 8);
        *(undefined8 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3) =
             *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3);
        *(undefined4 *)((long)this->m_sampleRegister[0].blendDstFactorRGB.m_data + lVar3 + 8) =
             uVar1;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x2100);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_COLOR:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          afStack_c[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_18 = *(undefined8 *)this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data;
        local_10 = this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar4 = 0;
        do {
          res.m_data[lVar4] = afStack_c[lVar4] - *(float *)((long)&local_18 + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_DST_COLOR:
    lVar3 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar3) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x24);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x2c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             uVar1;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_DST_COLOR:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          afStack_c[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_18 = *(undefined8 *)this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data;
        local_10 = this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar4 = 0;
        do {
          res.m_data[lVar4] = afStack_c[lVar4] - *(float *)((long)&local_18 + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_ONE_MINUS_SRC_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0 - fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_DST_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_ONE_MINUS_DST_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0 - fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_CONSTANT_COLOR:
    lVar3 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar3) == '\x01')
      {
        fVar2 = blendColor->m_data[2];
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)blendColor->m_data;
        *(float *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) = fVar2
        ;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          afStack_c[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_18 = *(undefined8 *)blendColor->m_data;
        local_10 = blendColor->m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar4 = 0;
        do {
          res.m_data[lVar4] = afStack_c[lVar4] - *(float *)((long)&local_18 + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_CONSTANT_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = blendColor->m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = blendColor->m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0 - fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC_ALPHA_SATURATE:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar6 = 1.0 - this->m_sampleRegister[lVar3].clampedBlendDstColor.m_data[3];
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrcColor.m_data[3];
        uVar5 = -(uint)(fVar2 <= fVar6);
        lVar4 = 0;
        do {
          res.m_data[lVar4] = (float)(uVar5 & (uint)fVar2 | ~uVar5 & (uint)fVar6);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC1_COLOR:
    lVar3 = 0x4c;
    do {
      if (*(char *)((long)(&this->m_sampleRegister[0].clampedBlendSrcColor + -5) + lVar3) == '\x01')
      {
        uVar1 = *(undefined4 *)
                 ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x34);
        *(undefined8 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0xc)
             = *(undefined8 *)
                ((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -0x3c);
        *(undefined4 *)((long)this->m_sampleRegister[0].clampedBlendSrcColor.m_data + lVar3 + -4) =
             uVar1;
      }
      lVar3 = lVar3 + 0x84;
    } while (lVar3 != 0x214c);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_COLOR:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        lVar4 = 0;
        do {
          afStack_c[lVar4] = 1.0;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        local_18 = *(undefined8 *)this->m_sampleRegister[lVar3].clampedBlendSrc1Color.m_data;
        local_10 = this->m_sampleRegister[lVar3].clampedBlendSrc1Color.m_data[2];
        res.m_data[0] = 0.0;
        res.m_data[1] = 0.0;
        res.m_data[2] = 0.0;
        lVar4 = 0;
        do {
          res.m_data[lVar4] = afStack_c[lVar4] - *(float *)((long)&local_18 + lVar4 * 4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_SRC1_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrc1Color.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
    break;
  case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:
    lVar3 = 0;
    do {
      if (this->m_sampleRegister[lVar3].isAlive == true) {
        fVar2 = this->m_sampleRegister[lVar3].clampedBlendSrc1Color.m_data[3];
        lVar4 = 0;
        do {
          res.m_data[lVar4] = 1.0 - fVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 3);
        this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data[2] = res.m_data[2];
        *(undefined8 *)this->m_sampleRegister[lVar3].blendDstFactorRGB.m_data = res.m_data._0_8_;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x40);
  }
  return;
}

Assistant:

void FragmentProcessor::executeBlendFactorComputeRGB (const Vec4& blendColor, const BlendState& blendRGBState)
{
#define SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, FACTOR_EXPRESSION)																				\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)																	\
	{																																				\
		if (m_sampleRegister[regSampleNdx].isAlive)																									\
		{																																			\
			const Vec4& src		= m_sampleRegister[regSampleNdx].clampedBlendSrcColor;																\
			const Vec4& src1	= m_sampleRegister[regSampleNdx].clampedBlendSrc1Color;																\
			const Vec4& dst		= m_sampleRegister[regSampleNdx].clampedBlendDstColor;																\
			DE_UNREF(src);																															\
			DE_UNREF(src1);																															\
			DE_UNREF(dst);																															\
																																					\
			m_sampleRegister[regSampleNdx].FACTOR_NAME = (FACTOR_EXPRESSION);																		\
		}																																			\
	}

#define SWITCH_SRC_OR_DST_FACTOR_RGB(FUNC_NAME, FACTOR_NAME)																					\
	switch (blendRGBState.FUNC_NAME)																											\
	{																																			\
		case BLENDFUNC_ZERO:						SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(0.0f))								break;	\
		case BLENDFUNC_ONE:							SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f))								break;	\
		case BLENDFUNC_SRC_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_SRC_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - src.swizzle(0,1,2))			break;	\
		case BLENDFUNC_DST_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, dst.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_DST_COLOR:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - dst.swizzle(0,1,2))			break;	\
		case BLENDFUNC_SRC_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(src.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_SRC_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - src.w()))						break;	\
		case BLENDFUNC_DST_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(dst.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_DST_ALPHA:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - dst.w()))						break;	\
		case BLENDFUNC_CONSTANT_COLOR:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, blendColor.swizzle(0,1,2))				break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_COLOR:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - blendColor.swizzle(0,1,2))	break;	\
		case BLENDFUNC_CONSTANT_ALPHA:				SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(blendColor.w()))						break;	\
		case BLENDFUNC_ONE_MINUS_CONSTANT_ALPHA:	SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - blendColor.w()))				break;	\
		case BLENDFUNC_SRC_ALPHA_SATURATE:			SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(de::min(src.w(), 1.0f - dst.w())))	break;	\
		case BLENDFUNC_SRC1_COLOR:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, src1.swizzle(0,1,2))						break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_COLOR:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f) - src1.swizzle(0,1,2))			break;	\
		case BLENDFUNC_SRC1_ALPHA:					SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(src1.w()))							break;	\
		case BLENDFUNC_ONE_MINUS_SRC1_ALPHA:		SAMPLE_REGISTER_BLEND_FACTOR(FACTOR_NAME, Vec3(1.0f - src1.w()))					break;	\
		default:																																\
			DE_ASSERT(false);																													\
	}

	SWITCH_SRC_OR_DST_FACTOR_RGB(srcFunc, blendSrcFactorRGB)
	SWITCH_SRC_OR_DST_FACTOR_RGB(dstFunc, blendDstFactorRGB)

#undef SWITCH_SRC_OR_DST_FACTOR_RGB
#undef SAMPLE_REGISTER_BLEND_FACTOR
}